

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DES.cpp
# Opt level: O2

void __thiscall QMT::DES::handle_data(DES *this,uint *left,int choice)

{
  uint *right;
  char cVar1;
  uint uVar2;
  int i;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  
  right = left + 1;
  uVar4 = 0;
  uVar5 = 0;
  for (uVar3 = 0; uVar3 != 0x40; uVar3 = uVar3 + 1) {
    cVar1 = this->wz_pc1[uVar3];
    uVar6 = (int)cVar1 - 1;
    uVar7 = (ulong)uVar6;
    if (uVar3 < 0x20) {
      if (cVar1 < '!') {
        uVar7 = (ulong)(int)uVar6;
        uVar6 = *left;
      }
      else {
        uVar6 = *right;
      }
      if ((this->wz_pc2[uVar7] & uVar6) != 0) {
        uVar4 = uVar4 | this->wz_pc2[uVar3];
      }
    }
    else {
      if (cVar1 < '!') {
        uVar6 = this->wz_pc2[(long)(int)cVar1 + -1] & *left;
      }
      else {
        uVar6 = this->wz_pc2[uVar7] & *right;
      }
      if (uVar6 != 0) {
        uVar5 = uVar5 | this->wz_pc2[uVar3];
      }
    }
  }
  *left = uVar4;
  left[1] = uVar5;
  if (choice == 0) {
    for (; choice != 0x10; choice = choice + 1) {
      makedata(this,left,right,choice);
    }
  }
  else if (choice == 1) {
    for (uVar4 = 0xf; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
      makedata(this,left,right,uVar4);
    }
  }
  uVar4 = *left;
  uVar5 = left[1];
  *left = uVar5;
  left[1] = uVar4;
  uVar6 = 0;
  uVar8 = 0;
  for (uVar3 = 0; uVar3 != 0x40; uVar3 = uVar3 + 1) {
    cVar1 = this->wz_pc4[uVar3];
    uVar2 = (int)cVar1 - 1;
    if (uVar3 < 0x20) {
      if (cVar1 < '!') {
        uVar2 = this->wz_pc2[(int)uVar2] & uVar5;
      }
      else {
        uVar2 = this->wz_pc2[uVar2] & uVar4;
      }
      if (uVar2 != 0) {
        uVar6 = uVar6 | this->wz_pc2[uVar3];
      }
    }
    else {
      if (cVar1 < '!') {
        uVar2 = this->wz_pc2[(long)(int)cVar1 + -1] & uVar5;
      }
      else {
        uVar2 = this->wz_pc2[uVar2] & uVar4;
      }
      if (uVar2 != 0) {
        uVar8 = uVar8 | this->wz_pc2[uVar3];
      }
    }
  }
  *left = uVar6;
  left[1] = uVar8;
  return;
}

Assistant:

void DES::handle_data(unsigned int *left , int choice)
  {
  	int  number = 0 ,j = 0;
  	unsigned int *right = &left[1];
  	unsigned int tmp = 0;
  	unsigned int tmpbuf[2] = { 0 };

  	for ( int i = 0; i < 64; ++i )
     {
       if ( i >= 32 )
       {
         if ( wz_pc1[i] <= 32 )
         {
           if ( wz_pc2[wz_pc1[i] - 1] & *left )
             tmpbuf[1] |= wz_pc2[i];
         }
         else if ( wz_pc2[wz_pc1[i] - 1] & *right )
         {
           tmpbuf[1] |= wz_pc2[i];
         }
       }
       else if ( wz_pc1[i] <= 32 )
       {
         if ( wz_pc2[wz_pc1[i] - 1] & *left )
           tmpbuf[0] |= wz_pc2[i];
       }
       else if ( wz_pc2[wz_pc1[i] - 1] & *right )
       {
         tmpbuf[0] |= wz_pc2[i];
       }
     }
  	*left  = tmpbuf[0];
  	*right = tmpbuf[1];
  	tmpbuf[0] = 0;
  	tmpbuf[1] = 0;
      switch(choice )
  	{
  		case DESENCRY:
  			for (number = 0; number < 16; number++)
  			{
  				makedata(left , right , (unsigned long)number);
  			}
  			break;
  		case DESDECRY:
  			for (number = 15; number >= 0; number--)
  			{
  				makedata(left , right ,(unsigned long)number);
  			}
  			break;
  		default:
  			break;
  	}

  	tmp = *left;
  	*left = *right;
  	*right = tmp;
  	for ( int l = 0; l < 64; ++l )
    {
      if ( l >= 32 )
      {
        if ( wz_pc4[l] <= 32 )
        {
          if ( wz_pc2[wz_pc4[l] - 1] & *left )
            tmpbuf[1] |= wz_pc2[l];
        }
        else if ( wz_pc2[wz_pc4[l] - 1] & *right )
        {
          tmpbuf[1] |= wz_pc2[l];
        }
      }
      else if ( wz_pc4[l] <= 32 )
      {
        if ( wz_pc2[wz_pc4[l] - 1] & *left )
          tmpbuf[0] |= wz_pc2[l];
      }
      else if ( wz_pc2[wz_pc4[l] - 1] & *right )
      {
        tmpbuf[0] |= wz_pc2[l];
      }
    }

  	*left =  tmpbuf[0];
  	*right = tmpbuf[1];
  }